

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O1

void opj_mqc_flush(opj_mqc_t *mqc)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = mqc->c | 0xffff;
  uVar2 = uVar1 - 0x8000;
  if (uVar1 < mqc->a + mqc->c) {
    uVar2 = uVar1;
  }
  mqc->c = uVar2 << ((byte)mqc->ct & 0x1f);
  opj_mqc_byteout(mqc);
  mqc->c = mqc->c << ((byte)mqc->ct & 0x1f);
  opj_mqc_byteout(mqc);
  if (*mqc->bp != 0xff) {
    mqc->bp = mqc->bp + 1;
  }
  return;
}

Assistant:

void opj_mqc_flush(opj_mqc_t *mqc) {
	opj_mqc_setbits(mqc);
	mqc->c <<= mqc->ct;
	opj_mqc_byteout(mqc);
	mqc->c <<= mqc->ct;
	opj_mqc_byteout(mqc);
	
	if (*mqc->bp != 0xff) {
		mqc->bp++;
	}
}